

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

size_t xemmai::t_type_of<xemmai::t_object>::f_do_left_shift(t_object *a_this,t_pvalue *a_stack)

{
  t_type *ptVar1;
  size_t sVar2;
  t_object *ptVar3;
  
  ptVar1 = a_this->v_type;
  sVar2 = ptVar1->v_instance_fields;
  ptVar3 = (t_object *)(&ptVar1[1].f_not_equals)[sVar2 * 3];
  if ((ptVar3 < (t_object *)0x5) || (ptVar3->v_type->v_bindable != true)) {
    (a_stack->super_t_pointer).v_p = (t_object *)(&ptVar1[1].f_not_equals)[sVar2 * 3];
    a_stack->field_0 =
         *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(&ptVar1[1].f_and + sVar2 * 3)
    ;
    a_this = (t_object *)0x0;
  }
  else {
    (a_stack->super_t_pointer).v_p = ptVar3;
  }
  a_stack[1].super_t_pointer.v_p = a_this;
  return 1;
}

Assistant:

t_type* f_type() const
	{
		return v_type;
	}